

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

bool * __thiscall
google::protobuf::internal::UntypedMapBase::GetKey<bool>(UntypedMapBase *this,NodeBase *node)

{
  if (((this->type_info_).field_0x3 & 0xf) == 0) {
    return (bool *)(node + 1);
  }
  GetKey<bool>();
}

Assistant:

T* GetKey(NodeBase* node) const {
    // Debug check that `T` matches what we expect from the type info.
    ABSL_DCHECK_EQ(static_cast<int>(StaticTypeKind<T>()),
                   static_cast<int>(type_info_.key_type));
    return reinterpret_cast<T*>(node->GetVoidKey());
  }